

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  unixInodeInfo *puVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  _func_int_sqlite3_file_ptr *p_Var7;
  UnixUnusedFd **ppUVar8;
  ulong uVar9;
  sqlite3_io_methods *psVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  sqlite3_io_methods *psVar15;
  UnixUnusedFd **ppUVar16;
  size_t sVar17;
  int *piVar18;
  unixInodeInfo **ppuVar19;
  char *pcVar20;
  mode_t m;
  sqlite3_io_methods *psVar21;
  uint uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  uint local_510;
  uint local_4fc;
  uint local_4f8;
  char local_4d8;
  char cStack_4d7;
  char cStack_4d6;
  char cStack_4d5;
  char cStack_4d4;
  char cStack_4d3;
  char cStack_4d2;
  char cStack_4d1;
  undefined8 uStack_4d0;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  char cStack_449;
  char zDb [513];
  char zTmpname [514];
  
  uVar11 = flags & 0xffffff00;
  pcVar20 = zPath;
  if (((flags & 4U) == 0) || (((uVar11 != 0x800 && (uVar11 != 0x80000)) && (uVar11 != 0x4000)))) {
    *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
    if (uVar11 == 0x100) {
      iVar12 = (*aSyscall[4].pCurrent)(zPath);
      if (iVar12 == 0) {
        unixEnterMutex();
        psVar15 = (sqlite3_io_methods *)0x0;
        ppuVar19 = &inodeList;
        while (puVar2 = *ppuVar19, puVar2 != (unixInodeInfo *)0x0) {
          if (((puVar2->fileId).dev == zDb._0_8_) && ((puVar2->fileId).ino == zDb._8_8_)) {
            ppUVar8 = &puVar2->pUnused;
            goto LAB_0013587f;
          }
          ppuVar19 = &puVar2->pNext;
        }
        goto LAB_0013589f;
      }
      goto LAB_0013578b;
    }
    bVar5 = false;
  }
  else {
    *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
    bVar5 = true;
  }
  local_510 = 0xffffffff;
  if (zPath == (char *)0x0) {
    pcVar20 = zTmpname;
    iVar12 = unixGetTempname(0x202,pcVar20);
    if (iVar12 != 0) {
      return 1;
    }
    bVar4 = false;
    local_510 = 0xffffffff;
  }
  else {
    bVar4 = false;
  }
  goto LAB_001358c6;
  while (ppUVar8 = (UnixUnusedFd **)&psVar15->xClose, *(int *)&psVar15->field_0x4 != flags) {
LAB_0013587f:
    ppUVar16 = ppUVar8;
    psVar15 = (sqlite3_io_methods *)*ppUVar16;
    if (psVar15 == (sqlite3_io_methods *)0x0) {
      psVar15 = (sqlite3_io_methods *)0x0;
      goto LAB_0013589f;
    }
  }
  *ppUVar16 = (UnixUnusedFd *)psVar15->xClose;
LAB_0013589f:
  unixLeaveMutex();
  if (psVar15 == (sqlite3_io_methods *)0x0) {
LAB_0013578b:
    psVar15 = (sqlite3_io_methods *)sqlite3_malloc(0x10);
    if (psVar15 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    local_510 = 0xffffffff;
  }
  else {
    local_510 = psVar15->iVersion;
  }
  pFile[6].pMethods = psVar15;
  bVar4 = true;
  bVar5 = false;
LAB_001358c6:
  uVar22 = flags & 8;
  uVar11 = flags & 1;
  iVar23 = (flags & 4U) * 0x10;
  iVar12 = iVar23 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar12 = iVar23;
  }
  uVar3 = iVar12 + (flags & 2U);
  if ((int)local_510 < 0) {
    uVar13 = flags & 0x80800;
    if (uVar13 == 0) {
      m = 0x180;
      if (uVar22 == 0) {
        m = 0;
      }
      local_4f8 = 0;
      local_4fc = 0;
    }
    else {
      uVar14 = sqlite3Strlen30(pcVar20);
      uVar9 = (ulong)uVar14;
      do {
        sVar17 = uVar9;
        uVar9 = sVar17 - 1;
      } while (pcVar20[sVar17 - 1] != '-');
      memcpy(zDb,pcVar20,sVar17 - 1);
      zDb[sVar17 - 1] = '\0';
      iVar12 = (*aSyscall[4].pCurrent)(zDb,&local_4d8);
      if (iVar12 != 0) {
        return 0x70a;
      }
      m = local_4c0 & 0x1ff;
      local_4fc = local_4bc;
      local_4f8 = local_4b8;
    }
    local_510 = robust_open(pcVar20,uVar3,m);
    if (-1 < (int)local_510) {
LAB_001359c7:
      if (uVar13 != 0) {
        (*aSyscall[0x14].pCurrent)((ulong)local_510,(ulong)local_4fc,(ulong)local_4f8);
      }
      goto LAB_001359fe;
    }
    piVar18 = __errno_location();
    if ((((flags & 0x12U) == 2) && (*piVar18 != 0x15)) &&
       (local_510 = robust_open(pcVar20,uVar3 & 0x20080,m), -1 < (int)local_510)) {
      flags = (flags & 0xffffffe8U) + 1;
      uVar11 = 1;
      goto LAB_001359c7;
    }
    sqlite3CantopenError(0x7061);
    iVar12 = 0xe;
    unixLogErrorAtLine(0xe,"open",pcVar20,0x7061);
LAB_00135cf4:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_001359fe:
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = flags;
    }
    psVar15 = pFile[6].pMethods;
    if (psVar15 != (sqlite3_io_methods *)0x0) {
      psVar15->iVersion = local_510;
      *(int *)&psVar15->field_0x4 = flags;
    }
    if (uVar22 != 0) {
      (*aSyscall[0x10].pCurrent)(pcVar20);
    }
    uVar3 = uVar22 * 4 + 2;
    if (uVar11 == 0) {
      uVar3 = uVar22 * 4;
    }
    uVar11 = uVar3 + 0x80;
    if (bVar4) {
      uVar11 = uVar3;
    }
    uVar22 = uVar11 | 8;
    if (!bVar5) {
      uVar22 = uVar11;
    }
    *(uint *)&pFile[3].pMethods = local_510;
    pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar22;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    pcVar20 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar22 & 0x40) != 0) {
      pcVar20 = zPath;
    }
    iVar12 = sqlite3_uri_boolean(pcVar20,"psow",1);
    if (iVar12 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar12 = strcmp(pVfs->zName,"unix-excl");
    if (iVar12 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar22 < '\0') {
      psVar15 = &nolockIoMethods;
LAB_00135b5a:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar15 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
      psVar21 = &posixIoMethods;
      if (psVar15 == &posixIoMethods) {
        unixEnterMutex();
        iVar12 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,zDb);
        if (iVar12 == 0) {
          local_4d8 = zDb[0];
          cStack_4d7 = zDb[1];
          cStack_4d6 = zDb[2];
          cStack_4d5 = zDb[3];
          cStack_4d4 = zDb[4];
          cStack_4d3 = zDb[5];
          cStack_4d2 = zDb[6];
          cStack_4d1 = zDb[7];
          uVar6 = _local_4d8;
          uStack_4d0 = (_func_int_sqlite3_file_ptr *)zDb._8_8_;
          p_Var7 = uStack_4d0;
          ppuVar19 = &inodeList;
          while (psVar15 = (sqlite3_io_methods *)*ppuVar19, _local_4d8 = uVar6, uStack_4d0 = p_Var7,
                psVar15 != (sqlite3_io_methods *)0x0) {
            local_4d8 = (char)zDb._0_8_;
            cStack_4d7 = SUB81(zDb._0_8_,1);
            cStack_4d6 = SUB81(zDb._0_8_,2);
            cStack_4d5 = SUB81(zDb._0_8_,3);
            cStack_4d4 = SUB81(zDb._0_8_,4);
            cStack_4d3 = SUB81(zDb._0_8_,5);
            cStack_4d2 = SUB81(zDb._0_8_,6);
            cStack_4d1 = SUB81(zDb._0_8_,7);
            uStack_4d0._0_1_ = (char)zDb._8_8_;
            uStack_4d0._1_1_ = SUB81(zDb._8_8_,1);
            uStack_4d0._2_1_ = SUB81(zDb._8_8_,2);
            uStack_4d0._3_1_ = SUB81(zDb._8_8_,3);
            uStack_4d0._4_1_ = SUB81(zDb._8_8_,4);
            uStack_4d0._5_1_ = SUB81(zDb._8_8_,5);
            uStack_4d0._6_1_ = SUB81(zDb._8_8_,6);
            uStack_4d0._7_1_ = SUB81(zDb._8_8_,7);
            auVar24[0] = -((char)((unixFileId *)&psVar15->iVersion)->dev == local_4d8);
            auVar24[1] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 1) ==
                          cStack_4d7);
            auVar24[2] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 2) ==
                          cStack_4d6);
            auVar24[3] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 3) ==
                          cStack_4d5);
            auVar24[4] = -(psVar15->field_0x4 == cStack_4d4);
            auVar24[5] = -(psVar15->field_0x5 == cStack_4d3);
            auVar24[6] = -(psVar15->field_0x6 == cStack_4d2);
            auVar24[7] = -(psVar15->field_0x7 == cStack_4d1);
            auVar24[8] = -(*(char *)&psVar15->xClose == (char)uStack_4d0);
            auVar24[9] = -(*(char *)((long)&psVar15->xClose + 1) == uStack_4d0._1_1_);
            auVar24[10] = -(*(char *)((long)&psVar15->xClose + 2) == uStack_4d0._2_1_);
            auVar24[0xb] = -(*(char *)((long)&psVar15->xClose + 3) == uStack_4d0._3_1_);
            auVar24[0xc] = -(*(char *)((long)&psVar15->xClose + 4) == uStack_4d0._4_1_);
            auVar24[0xd] = -(*(char *)((long)&psVar15->xClose + 5) == uStack_4d0._5_1_);
            auVar24[0xe] = -(*(char *)((long)&psVar15->xClose + 6) == uStack_4d0._6_1_);
            auVar24[0xf] = -(*(char *)((long)&psVar15->xClose + 7) == uStack_4d0._7_1_);
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar15->xWrite = *(int *)&psVar15->xWrite + 1;
              psVar10 = (sqlite3_io_methods *)inodeList;
              goto LAB_00135cc8;
            }
            ppuVar19 = (unixInodeInfo **)&psVar15->xLock;
          }
          psVar15 = (sqlite3_io_methods *)sqlite3_malloc(0x48);
          if (psVar15 == (sqlite3_io_methods *)0x0) {
            iVar12 = 7;
            goto LAB_00135ba7;
          }
          *(undefined1 (*) [16])&psVar15->xTruncate = (undefined1  [16])0x0;
          psVar15->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
          psVar15->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
          psVar15->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          *(undefined8 *)psVar15 = _local_4d8;
          psVar15->xClose = uStack_4d0;
          *(int *)&psVar15->xWrite = 1;
          psVar15->xLock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar15->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar10 = psVar15;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar15;
          }
LAB_00135cc8:
          inodeList = (unixInodeInfo *)psVar10;
          pFile[2].pMethods = psVar15;
          iVar12 = 0;
        }
        else {
          piVar18 = __errno_location();
          iVar23 = *piVar18;
          *(int *)&pFile[4].pMethods = iVar23;
          iVar12 = 10;
          if (iVar23 == 0x4b) {
            iVar12 = 0x16;
          }
LAB_00135ba7:
          robust_close((unixFile *)pFile,local_510,0x6e90);
          local_510 = 0xffffffff;
        }
        unixLeaveMutex();
      }
      else {
        psVar21 = &dotlockIoMethods;
        if (psVar15 != &dotlockIoMethods) goto LAB_00135b5a;
        sVar17 = strlen(zPath);
        iVar23 = (int)sVar17 + 6;
        psVar15 = (sqlite3_io_methods *)sqlite3_malloc(iVar23);
        if (psVar15 == (sqlite3_io_methods *)0x0) {
          iVar12 = 7;
        }
        else {
          iVar12 = 0;
          sqlite3_snprintf(iVar23,(char *)psVar15,"%s.lock",zPath);
        }
        pFile[5].pMethods = psVar15;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar15 = psVar21;
      if (iVar12 != 0) {
        if (-1 < (int)local_510) {
          robust_close((unixFile *)pFile,local_510,0x6ee5);
        }
        goto LAB_00135cf4;
      }
    }
    pFile->pMethods = psVar15;
    verifyDbFile((unixFile *)pFile);
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int syncDir = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM;
      }
    }
    p->pUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !syncDir);
    rc = unixGetTempname(MAX_PATHNAME+2, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    if( fd<0 && errno!=EISDIR && isReadWrite && !isExclusive ){
      /* Failed to open the file for read/write access. Try read-only. */
      flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
      openFlags &= ~(O_RDWR|O_CREAT);
      flags |= SQLITE_OPEN_READONLY;
      openFlags |= O_RDONLY;
      isReadonly = 1;
      fd = robust_open(zName, openFlags, openMode);
    }
    if( fd<0 ){
      rc = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      osFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

  noLock = eType!=SQLITE_OPEN_MAIN_DB;

  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( syncDir )                 ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      if( statfs(zPath, &fsInfo) == -1 ){
        /* In theory, the close(fd) call is sub-optimal. If the file opened
        ** with fd is a database file, and there are other connections open
        ** on that file that are currently holding advisory locks on it,
        ** then the call to close() will cancel those locks. In practice,
        ** we're assuming that statfs() doesn't fail very often. At least
        ** not while other file descriptors opened by the same process on
        ** the same file are working.  */
        p->lastErrno = errno;
        robust_close(p, fd, __LINE__);
        rc = SQLITE_IOERR_ACCESS;
        goto open_finished;
      }
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pUnused);
  }
  return rc;
}